

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_netstd_generator.cc
# Opt level: O0

void __thiscall
t_netstd_generator::generate_netstd_union_class
          (t_netstd_generator *this,ostream *out,t_struct *tunion,t_field *tfield)

{
  t_field *tfield_00;
  t_struct *ptVar1;
  int32_t iVar2;
  int iVar3;
  ostream *poVar4;
  t_type *ptVar5;
  string *psVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  string local_788;
  string local_768;
  string local_748;
  string local_728;
  string local_708;
  string local_6e8;
  string local_6c8;
  string local_6a8;
  string local_688;
  string local_668;
  allocator local_641;
  string local_640;
  string local_620;
  string local_600;
  string local_5e0;
  string local_5c0;
  string local_5a0;
  string local_580;
  string local_560;
  string local_540;
  string local_520;
  string local_500;
  string local_4e0;
  string local_4c0;
  string local_4a0;
  string local_480;
  string local_460;
  string local_440;
  string local_420;
  string local_400;
  string local_3e0;
  string local_3c0;
  string local_3a0;
  string local_380;
  string local_360;
  string local_340;
  undefined1 local_320 [8];
  string copy_op;
  undefined1 local_2f8 [7];
  bool needs_typecast;
  string local_2d8;
  string local_2b8;
  string local_298;
  string local_278;
  string local_258;
  string local_238;
  string local_218;
  string local_1f8;
  string local_1d8;
  string local_1b8;
  string local_198;
  string local_178;
  string local_158;
  string local_138;
  string local_118;
  string local_f8;
  string local_d8;
  string local_b8;
  string local_98;
  string local_78;
  string local_48;
  t_field *local_28;
  t_field *tfield_local;
  t_struct *tunion_local;
  ostream *out_local;
  t_netstd_generator *this_local;
  
  local_28 = tfield;
  tfield_local = (t_field *)tunion;
  tunion_local = (t_struct *)out;
  out_local = (ostream *)this;
  t_generator::indent_abi_cxx11_(&local_48,(t_generator *)this);
  poVar4 = std::operator<<(out,(string *)&local_48);
  poVar4 = std::operator<<(poVar4,"public ");
  ptVar5 = t_field::get_type(local_28);
  type_name_abi_cxx11_(&local_78,this,ptVar5,true);
  poVar4 = std::operator<<(poVar4,(string *)&local_78);
  poVar4 = std::operator<<(poVar4," As_");
  psVar6 = t_field::get_name_abi_cxx11_(local_28);
  poVar4 = std::operator<<(poVar4,(string *)psVar6);
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_48);
  ptVar1 = tunion_local;
  t_generator::indent_abi_cxx11_(&local_98,(t_generator *)this);
  poVar4 = std::operator<<((ostream *)ptVar1,(string *)&local_98);
  poVar4 = std::operator<<(poVar4,"{");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_98);
  t_generator::indent_up((t_generator *)this);
  ptVar1 = tunion_local;
  t_generator::indent_abi_cxx11_(&local_b8,(t_generator *)this);
  poVar4 = std::operator<<((ostream *)ptVar1,(string *)&local_b8);
  poVar4 = std::operator<<(poVar4,"get");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_b8);
  ptVar1 = tunion_local;
  t_generator::indent_abi_cxx11_(&local_d8,(t_generator *)this);
  poVar4 = std::operator<<((ostream *)ptVar1,(string *)&local_d8);
  poVar4 = std::operator<<(poVar4,"{");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_d8);
  t_generator::indent_up((t_generator *)this);
  ptVar1 = tunion_local;
  t_generator::indent_abi_cxx11_(&local_f8,(t_generator *)this);
  poVar4 = std::operator<<((ostream *)ptVar1,(string *)&local_f8);
  poVar4 = std::operator<<(poVar4,"return (");
  iVar2 = t_field::get_key(local_28);
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar2);
  poVar4 = std::operator<<(poVar4," == Isset) ? (");
  ptVar5 = t_field::get_type(local_28);
  type_name_abi_cxx11_(&local_118,this,ptVar5,true);
  poVar4 = std::operator<<(poVar4,(string *)&local_118);
  poVar4 = std::operator<<(poVar4,")Data : default(");
  ptVar5 = t_field::get_type(local_28);
  type_name_abi_cxx11_(&local_138,this,ptVar5,true);
  poVar4 = std::operator<<(poVar4,(string *)&local_138);
  poVar4 = std::operator<<(poVar4,");");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_138);
  std::__cxx11::string::~string((string *)&local_118);
  std::__cxx11::string::~string((string *)&local_f8);
  t_generator::indent_down((t_generator *)this);
  ptVar1 = tunion_local;
  t_generator::indent_abi_cxx11_(&local_158,(t_generator *)this);
  poVar4 = std::operator<<((ostream *)ptVar1,(string *)&local_158);
  poVar4 = std::operator<<(poVar4,"}");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_158);
  t_generator::indent_down((t_generator *)this);
  ptVar1 = tunion_local;
  t_generator::indent_abi_cxx11_(&local_178,(t_generator *)this);
  poVar4 = std::operator<<((ostream *)ptVar1,(string *)&local_178);
  poVar4 = std::operator<<(poVar4,"}");
  poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_178);
  ptVar1 = tunion_local;
  t_generator::indent_abi_cxx11_(&local_198,(t_generator *)this);
  poVar4 = std::operator<<((ostream *)ptVar1,(string *)&local_198);
  poVar4 = std::operator<<(poVar4,"public class ");
  psVar6 = t_field::get_name_abi_cxx11_(local_28);
  poVar4 = std::operator<<(poVar4,(string *)psVar6);
  poVar4 = std::operator<<(poVar4," : ");
  iVar3 = (*(tfield_local->super_t_doc)._vptr_t_doc[3])();
  poVar4 = std::operator<<(poVar4,(string *)CONCAT44(extraout_var,iVar3));
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_198);
  ptVar1 = tunion_local;
  t_generator::indent_abi_cxx11_(&local_1b8,(t_generator *)this);
  poVar4 = std::operator<<((ostream *)ptVar1,(string *)&local_1b8);
  poVar4 = std::operator<<(poVar4,"{");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_1b8);
  t_generator::indent_up((t_generator *)this);
  ptVar1 = tunion_local;
  t_generator::indent_abi_cxx11_(&local_1d8,(t_generator *)this);
  poVar4 = std::operator<<((ostream *)ptVar1,(string *)&local_1d8);
  poVar4 = std::operator<<(poVar4,"private ");
  ptVar5 = t_field::get_type(local_28);
  type_name_abi_cxx11_(&local_1f8,this,ptVar5,true);
  poVar4 = std::operator<<(poVar4,(string *)&local_1f8);
  poVar4 = std::operator<<(poVar4," _data;");
  poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_218,(t_generator *)this);
  poVar4 = std::operator<<(poVar4,(string *)&local_218);
  poVar4 = std::operator<<(poVar4,"public override object Data { get { return _data; } }");
  poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_238,(t_generator *)this);
  poVar4 = std::operator<<(poVar4,(string *)&local_238);
  poVar4 = std::operator<<(poVar4,"public ");
  psVar6 = t_field::get_name_abi_cxx11_(local_28);
  poVar4 = std::operator<<(poVar4,(string *)psVar6);
  poVar4 = std::operator<<(poVar4,"(");
  ptVar5 = t_field::get_type(local_28);
  type_name_abi_cxx11_(&local_258,this,ptVar5,true);
  poVar4 = std::operator<<(poVar4,(string *)&local_258);
  poVar4 = std::operator<<(poVar4," data) : base(");
  iVar2 = t_field::get_key(local_28);
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar2);
  poVar4 = std::operator<<(poVar4,")");
  poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_278,(t_generator *)this);
  poVar4 = std::operator<<(poVar4,(string *)&local_278);
  poVar4 = std::operator<<(poVar4,"{");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_278);
  std::__cxx11::string::~string((string *)&local_258);
  std::__cxx11::string::~string((string *)&local_238);
  std::__cxx11::string::~string((string *)&local_218);
  std::__cxx11::string::~string((string *)&local_1f8);
  std::__cxx11::string::~string((string *)&local_1d8);
  t_generator::indent_up((t_generator *)this);
  ptVar1 = tunion_local;
  t_generator::indent_abi_cxx11_(&local_298,(t_generator *)this);
  poVar4 = std::operator<<((ostream *)ptVar1,(string *)&local_298);
  poVar4 = std::operator<<(poVar4,"this._data = data;");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_298);
  t_generator::indent_down((t_generator *)this);
  ptVar1 = tunion_local;
  t_generator::indent_abi_cxx11_(&local_2b8,(t_generator *)this);
  poVar4 = std::operator<<((ostream *)ptVar1,(string *)&local_2b8);
  poVar4 = std::operator<<(poVar4,"}");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_2b8);
  ptVar1 = tunion_local;
  if ((this->suppress_deepcopy & 1U) == 0) {
    t_generator::indent_abi_cxx11_(&local_2d8,(t_generator *)this);
    poVar4 = std::operator<<((ostream *)ptVar1,(string *)&local_2d8);
    poVar4 = std::operator<<(poVar4,"public new ");
    psVar6 = t_field::get_name_abi_cxx11_(local_28);
    poVar4 = std::operator<<(poVar4,(string *)psVar6);
    poVar4 = std::operator<<(poVar4," DeepCopy()");
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_2d8);
    ptVar1 = tunion_local;
    t_generator::indent_abi_cxx11_((string *)local_2f8,(t_generator *)this);
    poVar4 = std::operator<<((ostream *)ptVar1,(string *)local_2f8);
    poVar4 = std::operator<<(poVar4,"{");
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)local_2f8);
    t_generator::indent_up((t_generator *)this);
    copy_op.field_2._M_local_buf[0xf] = '\0';
    ptVar5 = t_field::get_type(local_28);
    get_deep_copy_method_call_abi_cxx11_
              ((string *)local_320,this,ptVar5,(bool *)(copy_op.field_2._M_local_buf + 0xf));
    ptVar1 = tunion_local;
    t_generator::indent_abi_cxx11_(&local_340,(t_generator *)this);
    poVar4 = std::operator<<((ostream *)ptVar1,(string *)&local_340);
    poVar4 = std::operator<<(poVar4,"return new ");
    psVar6 = t_field::get_name_abi_cxx11_(local_28);
    poVar4 = std::operator<<(poVar4,(string *)psVar6);
    poVar4 = std::operator<<(poVar4,"(_data");
    poVar4 = std::operator<<(poVar4,(string *)local_320);
    poVar4 = std::operator<<(poVar4,");");
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_340);
    t_generator::indent_down((t_generator *)this);
    ptVar1 = tunion_local;
    t_generator::indent_abi_cxx11_(&local_360,(t_generator *)this);
    poVar4 = std::operator<<((ostream *)ptVar1,(string *)&local_360);
    poVar4 = std::operator<<(poVar4,"}");
    poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_360);
    std::__cxx11::string::~string((string *)local_320);
  }
  ptVar1 = tunion_local;
  t_generator::indent_abi_cxx11_(&local_380,(t_generator *)this);
  poVar4 = std::operator<<((ostream *)ptVar1,(string *)&local_380);
  poVar4 = std::operator<<(poVar4,"public override bool Equals(object that)");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_380);
  ptVar1 = tunion_local;
  t_generator::indent_abi_cxx11_(&local_3a0,(t_generator *)this);
  poVar4 = std::operator<<((ostream *)ptVar1,(string *)&local_3a0);
  poVar4 = std::operator<<(poVar4,"{");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_3a0);
  t_generator::indent_up((t_generator *)this);
  ptVar1 = tunion_local;
  t_generator::indent_abi_cxx11_(&local_3c0,(t_generator *)this);
  poVar4 = std::operator<<((ostream *)ptVar1,(string *)&local_3c0);
  poVar4 = std::operator<<(poVar4,"if (!(that is ");
  iVar3 = (*(tfield_local->super_t_doc)._vptr_t_doc[3])();
  poVar4 = std::operator<<(poVar4,(string *)CONCAT44(extraout_var_00,iVar3));
  poVar4 = std::operator<<(poVar4," other)) return false;");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_3c0);
  ptVar1 = tunion_local;
  t_generator::indent_abi_cxx11_(&local_3e0,(t_generator *)this);
  poVar4 = std::operator<<((ostream *)ptVar1,(string *)&local_3e0);
  poVar4 = std::operator<<(poVar4,"if (ReferenceEquals(this, other)) return true;");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_3e0);
  std::operator<<((ostream *)tunion_local,(string *)&::endl_abi_cxx11_);
  ptVar1 = tunion_local;
  t_generator::indent_abi_cxx11_(&local_400,(t_generator *)this);
  poVar4 = std::operator<<((ostream *)ptVar1,(string *)&local_400);
  poVar4 = std::operator<<(poVar4,"return Equals( _data, other.As_");
  psVar6 = t_field::get_name_abi_cxx11_(local_28);
  poVar4 = std::operator<<(poVar4,(string *)psVar6);
  poVar4 = std::operator<<(poVar4,");");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_400);
  t_generator::indent_down((t_generator *)this);
  ptVar1 = tunion_local;
  t_generator::indent_abi_cxx11_(&local_420,(t_generator *)this);
  poVar4 = std::operator<<((ostream *)ptVar1,(string *)&local_420);
  poVar4 = std::operator<<(poVar4,"}");
  poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_420);
  ptVar1 = tunion_local;
  t_generator::indent_abi_cxx11_(&local_440,(t_generator *)this);
  poVar4 = std::operator<<((ostream *)ptVar1,(string *)&local_440);
  poVar4 = std::operator<<(poVar4,"public override int GetHashCode()");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_440);
  ptVar1 = tunion_local;
  t_generator::indent_abi_cxx11_(&local_460,(t_generator *)this);
  poVar4 = std::operator<<((ostream *)ptVar1,(string *)&local_460);
  poVar4 = std::operator<<(poVar4,"{");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_460);
  t_generator::indent_up((t_generator *)this);
  ptVar1 = tunion_local;
  t_generator::indent_abi_cxx11_(&local_480,(t_generator *)this);
  poVar4 = std::operator<<((ostream *)ptVar1,(string *)&local_480);
  poVar4 = std::operator<<(poVar4,"return _data.GetHashCode();");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_480);
  t_generator::indent_down((t_generator *)this);
  ptVar1 = tunion_local;
  t_generator::indent_abi_cxx11_(&local_4a0,(t_generator *)this);
  poVar4 = std::operator<<((ostream *)ptVar1,(string *)&local_4a0);
  poVar4 = std::operator<<(poVar4,"}");
  poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_4a0);
  ptVar1 = tunion_local;
  t_generator::indent_abi_cxx11_(&local_4c0,(t_generator *)this);
  poVar4 = std::operator<<((ostream *)ptVar1,(string *)&local_4c0);
  poVar4 = std::operator<<(poVar4,
                           "public override async global::System.Threading.Tasks.Task WriteAsync(TProtocol oprot, CancellationToken "
                          );
  poVar4 = std::operator<<(poVar4,(string *)&CANCELLATION_TOKEN_NAME_abi_cxx11_);
  poVar4 = std::operator<<(poVar4,") {");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_4c0);
  t_generator::indent_up((t_generator *)this);
  ptVar1 = tunion_local;
  t_generator::indent_abi_cxx11_(&local_4e0,(t_generator *)this);
  poVar4 = std::operator<<((ostream *)ptVar1,(string *)&local_4e0);
  poVar4 = std::operator<<(poVar4,"oprot.IncrementRecursionDepth();");
  poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_500,(t_generator *)this);
  poVar4 = std::operator<<(poVar4,(string *)&local_500);
  poVar4 = std::operator<<(poVar4,"try");
  poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_520,(t_generator *)this);
  poVar4 = std::operator<<(poVar4,(string *)&local_520);
  poVar4 = std::operator<<(poVar4,"{");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_520);
  std::__cxx11::string::~string((string *)&local_500);
  std::__cxx11::string::~string((string *)&local_4e0);
  t_generator::indent_up((t_generator *)this);
  ptVar1 = tunion_local;
  t_generator::indent_abi_cxx11_(&local_540,(t_generator *)this);
  poVar4 = std::operator<<((ostream *)ptVar1,(string *)&local_540);
  poVar4 = std::operator<<(poVar4,"var struc = new TStruct(\"");
  iVar3 = (*(tfield_local->super_t_doc)._vptr_t_doc[3])();
  poVar4 = std::operator<<(poVar4,(string *)CONCAT44(extraout_var_01,iVar3));
  poVar4 = std::operator<<(poVar4,"\");");
  poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_560,(t_generator *)this);
  poVar4 = std::operator<<(poVar4,(string *)&local_560);
  poVar4 = std::operator<<(poVar4,"await oprot.WriteStructBeginAsync(struc, ");
  poVar4 = std::operator<<(poVar4,(string *)&CANCELLATION_TOKEN_NAME_abi_cxx11_);
  poVar4 = std::operator<<(poVar4,");");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_560);
  std::__cxx11::string::~string((string *)&local_540);
  ptVar1 = tunion_local;
  t_generator::indent_abi_cxx11_(&local_580,(t_generator *)this);
  poVar4 = std::operator<<((ostream *)ptVar1,(string *)&local_580);
  poVar4 = std::operator<<(poVar4,"var field = new TField();");
  poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_5a0,(t_generator *)this);
  poVar4 = std::operator<<(poVar4,(string *)&local_5a0);
  poVar4 = std::operator<<(poVar4,"field.Name = \"");
  psVar6 = t_field::get_name_abi_cxx11_(local_28);
  poVar4 = std::operator<<(poVar4,(string *)psVar6);
  poVar4 = std::operator<<(poVar4,"\";");
  poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_5c0,(t_generator *)this);
  poVar4 = std::operator<<(poVar4,(string *)&local_5c0);
  poVar4 = std::operator<<(poVar4,"field.Type = ");
  ptVar5 = t_field::get_type(local_28);
  type_to_enum_abi_cxx11_(&local_5e0,this,ptVar5);
  poVar4 = std::operator<<(poVar4,(string *)&local_5e0);
  poVar4 = std::operator<<(poVar4,";");
  poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_600,(t_generator *)this);
  poVar4 = std::operator<<(poVar4,(string *)&local_600);
  poVar4 = std::operator<<(poVar4,"field.ID = ");
  iVar2 = t_field::get_key(local_28);
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar2);
  poVar4 = std::operator<<(poVar4,";");
  poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_620,(t_generator *)this);
  poVar4 = std::operator<<(poVar4,(string *)&local_620);
  poVar4 = std::operator<<(poVar4,"await oprot.WriteFieldBeginAsync(field, ");
  poVar4 = std::operator<<(poVar4,(string *)&CANCELLATION_TOKEN_NAME_abi_cxx11_);
  poVar4 = std::operator<<(poVar4,");");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_620);
  std::__cxx11::string::~string((string *)&local_600);
  std::__cxx11::string::~string((string *)&local_5e0);
  std::__cxx11::string::~string((string *)&local_5c0);
  std::__cxx11::string::~string((string *)&local_5a0);
  std::__cxx11::string::~string((string *)&local_580);
  ptVar1 = tunion_local;
  tfield_00 = local_28;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_640,"_data",&local_641);
  generate_serialize_field(this,(ostream *)ptVar1,tfield_00,&local_640,true);
  std::__cxx11::string::~string((string *)&local_640);
  std::allocator<char>::~allocator((allocator<char> *)&local_641);
  ptVar1 = tunion_local;
  t_generator::indent_abi_cxx11_(&local_668,(t_generator *)this);
  poVar4 = std::operator<<((ostream *)ptVar1,(string *)&local_668);
  poVar4 = std::operator<<(poVar4,"await oprot.WriteFieldEndAsync(");
  poVar4 = std::operator<<(poVar4,(string *)&CANCELLATION_TOKEN_NAME_abi_cxx11_);
  poVar4 = std::operator<<(poVar4,");");
  poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_688,(t_generator *)this);
  poVar4 = std::operator<<(poVar4,(string *)&local_688);
  poVar4 = std::operator<<(poVar4,"await oprot.WriteFieldStopAsync(");
  poVar4 = std::operator<<(poVar4,(string *)&CANCELLATION_TOKEN_NAME_abi_cxx11_);
  poVar4 = std::operator<<(poVar4,");");
  poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_6a8,(t_generator *)this);
  poVar4 = std::operator<<(poVar4,(string *)&local_6a8);
  poVar4 = std::operator<<(poVar4,"await oprot.WriteStructEndAsync(");
  poVar4 = std::operator<<(poVar4,(string *)&CANCELLATION_TOKEN_NAME_abi_cxx11_);
  poVar4 = std::operator<<(poVar4,");");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_6a8);
  std::__cxx11::string::~string((string *)&local_688);
  std::__cxx11::string::~string((string *)&local_668);
  t_generator::indent_down((t_generator *)this);
  ptVar1 = tunion_local;
  t_generator::indent_abi_cxx11_(&local_6c8,(t_generator *)this);
  poVar4 = std::operator<<((ostream *)ptVar1,(string *)&local_6c8);
  poVar4 = std::operator<<(poVar4,"}");
  poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_6e8,(t_generator *)this);
  poVar4 = std::operator<<(poVar4,(string *)&local_6e8);
  poVar4 = std::operator<<(poVar4,"finally");
  poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_708,(t_generator *)this);
  poVar4 = std::operator<<(poVar4,(string *)&local_708);
  poVar4 = std::operator<<(poVar4,"{");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_708);
  std::__cxx11::string::~string((string *)&local_6e8);
  std::__cxx11::string::~string((string *)&local_6c8);
  t_generator::indent_up((t_generator *)this);
  ptVar1 = tunion_local;
  t_generator::indent_abi_cxx11_(&local_728,(t_generator *)this);
  poVar4 = std::operator<<((ostream *)ptVar1,(string *)&local_728);
  poVar4 = std::operator<<(poVar4,"oprot.DecrementRecursionDepth();");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_728);
  t_generator::indent_down((t_generator *)this);
  ptVar1 = tunion_local;
  t_generator::indent_abi_cxx11_(&local_748,(t_generator *)this);
  poVar4 = std::operator<<((ostream *)ptVar1,(string *)&local_748);
  poVar4 = std::operator<<(poVar4,"}");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_748);
  t_generator::indent_down((t_generator *)this);
  ptVar1 = tunion_local;
  t_generator::indent_abi_cxx11_(&local_768,(t_generator *)this);
  poVar4 = std::operator<<((ostream *)ptVar1,(string *)&local_768);
  poVar4 = std::operator<<(poVar4,"}");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_768);
  t_generator::indent_down((t_generator *)this);
  ptVar1 = tunion_local;
  t_generator::indent_abi_cxx11_(&local_788,(t_generator *)this);
  poVar4 = std::operator<<((ostream *)ptVar1,(string *)&local_788);
  poVar4 = std::operator<<(poVar4,"}");
  poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_788);
  return;
}

Assistant:

void t_netstd_generator::generate_netstd_union_class(ostream& out, t_struct* tunion, t_field* tfield)
{
    out << indent() << "public " << type_name(tfield->get_type()) << " As_" << tfield->get_name() << endl;
    out << indent() << "{" << endl;
    indent_up();
    out << indent() << "get" << endl;
    out << indent() << "{" << endl;
    indent_up();
    out << indent() << "return (" << tfield->get_key() << " == Isset) ? (" << type_name(tfield->get_type()) << ")Data : default(" << type_name(tfield->get_type()) << ");" << endl;
    indent_down();
    out << indent() << "}" << endl;
    indent_down();
    out << indent() << "}" << endl
        << endl;


    out << indent() << "public class " << tfield->get_name() << " : " << tunion->get_name() << endl;
    out << indent() << "{" << endl;
    indent_up();

    out << indent() << "private " << type_name(tfield->get_type()) << " _data;" << endl
        << indent() << "public override object Data { get { return _data; } }" << endl
        << indent() << "public " << tfield->get_name() << "(" << type_name(tfield->get_type()) << " data) : base("<< tfield->get_key() <<")" << endl
        << indent() << "{" << endl;
    indent_up();
    out << indent() << "this._data = data;" << endl;
    indent_down();
    out << indent() << "}" << endl;

    if( ! suppress_deepcopy) {
        out << indent() << "public new " << tfield->get_name() << " DeepCopy()" << endl;
        out << indent() << "{" << endl;
        indent_up();
        bool needs_typecast = false;
        string copy_op = get_deep_copy_method_call(tfield->get_type(), needs_typecast);
        out << indent() << "return new " << tfield->get_name() << "(_data" << copy_op << ");" << endl;
        indent_down();
        out << indent() << "}" << endl << endl;
    }

    out << indent() << "public override bool Equals(object that)" << endl;
    out << indent() << "{" << endl;
    indent_up();
    out << indent() << "if (!(that is " << tunion->get_name() << " other)) return false;" << endl;
    out << indent() << "if (ReferenceEquals(this, other)) return true;" << endl;
    out << endl;
    out << indent() << "return Equals( _data, other.As_" << tfield->get_name() << ");" << endl;
    indent_down();
    out << indent() << "}" << endl << endl;

    out << indent() << "public override int GetHashCode()" << endl;
    out << indent() << "{" << endl;
    indent_up();
    out << indent() << "return _data.GetHashCode();" << endl;
    indent_down();
    out << indent() << "}" << endl << endl;

    out << indent() << "public override async global::System.Threading.Tasks.Task WriteAsync(TProtocol oprot, CancellationToken " << CANCELLATION_TOKEN_NAME << ") {" << endl;
    indent_up();

    out << indent() << "oprot.IncrementRecursionDepth();" << endl
        << indent() << "try" << endl
        << indent() << "{" << endl;
    indent_up();

    out << indent() << "var struc = new TStruct(\"" << tunion->get_name() << "\");" << endl
        << indent() << "await oprot.WriteStructBeginAsync(struc, " << CANCELLATION_TOKEN_NAME << ");" << endl;

    out << indent() << "var field = new TField();" << endl
        << indent() << "field.Name = \"" << tfield->get_name() << "\";" << endl
        << indent() << "field.Type = " << type_to_enum(tfield->get_type()) << ";" << endl
        << indent() << "field.ID = " << tfield->get_key() << ";" << endl
        << indent() << "await oprot.WriteFieldBeginAsync(field, " << CANCELLATION_TOKEN_NAME << ");" << endl;

    generate_serialize_field(out, tfield, "_data", true);

    out << indent() << "await oprot.WriteFieldEndAsync(" << CANCELLATION_TOKEN_NAME << ");" << endl
        << indent() << "await oprot.WriteFieldStopAsync(" << CANCELLATION_TOKEN_NAME << ");" << endl
        << indent() << "await oprot.WriteStructEndAsync(" << CANCELLATION_TOKEN_NAME << ");" << endl;
    indent_down();
    out << indent() << "}" << endl
        << indent() << "finally" << endl
        << indent() << "{" << endl;
    indent_up();
    out << indent() << "oprot.DecrementRecursionDepth();" << endl;
    indent_down();
    out << indent() << "}" << endl;
    indent_down();
    out << indent() << "}" << endl;
    indent_down();
    out << indent() << "}" << endl << endl;
}